

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O2

int q2_path(int srow,int scol,int y2,int x2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  
  iVar3 = scol - x2;
  iVar6 = srow - y2;
  iVar1 = iVar3 * 2;
  iVar2 = iVar6 * 2;
  if (iVar3 < iVar6) {
    uVar4 = iVar1 - iVar6;
    for (lVar5 = 0; (y2 - srow) + 1 != (int)lVar5; lVar5 = lVar5 + -1) {
      scol = scol + ((int)~uVar4 >> 0x1f);
      if (*(char *)(*(long *)((long)srow * 8 + 0x3578f8 + lVar5 * 8) + (long)scol) == '\0') {
        return 0;
      }
      iVar3 = 0;
      if (-1 < (int)uVar4) {
        iVar3 = iVar2;
      }
      uVar4 = (uVar4 + iVar1) - iVar3;
    }
  }
  else {
    uVar4 = iVar2 - iVar3;
    lVar5 = (long)scol;
    iVar3 = x2 - scol;
    while (iVar3 = iVar3 + 1, iVar3 != 0) {
      srow = srow + ((int)~uVar4 >> 0x1f);
      if (viz_clear_rows[srow][lVar5 + -1] == '\0') {
        return 0;
      }
      iVar6 = 0;
      if (-1 < (int)uVar4) {
        iVar6 = iVar1;
      }
      uVar4 = (uVar4 + iVar2) - iVar6;
      lVar5 = lVar5 + -1;
    }
  }
  return 1;
}

Assistant:

static int q2_path(int srow, int scol, int y2, int x2)
{
    int dx, dy;
    int k, err, x, y, dxs, dys;

    x  = scol;		y  = srow;
    dx = x - x2;	dy = y - y2;

    dxs = dx << 1;	   /* save the shifted values */
    dys = dy << 1;
    if (dy > dx) {
	err = dxs - dy;

	for (k = dy-1; k; k--) {
	    if (err >= 0) {
		x--;
		err -= dys;
	    }
	    y--;
	    err += dxs;
	    if (!is_clear(y,x)) return 0; /* blocked */
	}
    } else {
	err = dys - dx;

	for (k = dx-1; k; k--) {
	    if (err >= 0) {
		y--;
		err -= dxs;
	    }
	    x--;
	    err += dys;
	    if (!is_clear(y,x)) return 0;/* blocked */
	}
    }

    return 1;
}